

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-unix.c
# Opt level: O1

void cilkos_error(char *fmt,...)

{
  va_list l;
  
  fflush((FILE *)0x0);
  __fprintf_chk(_stderr,1,"Cilk error: ");
  __vfprintf_chk(_stderr,1,fmt);
  __fprintf_chk(_stderr,1,"Exiting.\n");
  fflush(_stderr);
  abort();
}

Assistant:

COMMON_SYSDEP void cilkos_error(const char *fmt, ...)
{
    va_list l;
    fflush(NULL);
    fprintf(stderr, "Cilk error: ");
    va_start(l, fmt);
    vfprintf(stderr, fmt, l);
    va_end(l);
    fprintf(stderr, "Exiting.\n");
    fflush(stderr);

    abort();
}